

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O0

void Eigen::internal::
     outer_product_selector_run<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>,_1,1,false>const>,Eigen::Map<Eigen::Matrix<float,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>,Eigen::internal::generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>,_1,1,false>const>,Eigen::Map<Eigen::Matrix<float,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
               (Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>
                *dst,CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>
                     *lhs,Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> *rhs,
               sub *func,false_type *param_5)

{
  long lVar1;
  sub *this;
  Scalar *ptr;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>
  *xpr;
  Index IVar2;
  CoeffReturnType scalar;
  undefined1 *puVar3;
  undefined1 auStack_198 [8];
  CoeffReturnType local_190;
  sub *local_188;
  Scalar *local_180;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>
  *local_178;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_16,_Eigen::Stride<0,_0>_>_>
  local_170;
  ColXpr local_138;
  long local_a0;
  Index j;
  Index cols;
  ObjectType actual_lhs;
  undefined1 local_68 [8];
  local_nested_eval_wrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>,__1,_true>
  actual_lhs_wrapper;
  evaluator<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_> rhsEval;
  false_type *param_4_local;
  sub *func_local;
  Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> *rhs_local;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>
  *lhs_local;
  Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>
  *dst_local;
  
  puVar3 = auStack_198;
  evaluator<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::evaluator
            ((evaluator<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&actual_lhs_wrapper.m_deallocate,rhs);
  local_178 = lhs;
  IVar2 = EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>_>
          ::size((EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>_>
                  *)lhs);
  if ((ulong)(IVar2 * 4) < 0x20001) {
    IVar2 = EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>_>
            ::size((EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>_>
                    *)lhs);
    lVar1 = -(IVar2 * 4 + 0x1eU & 0xfffffffffffffff0);
    puVar3 = auStack_198 + lVar1;
    local_180 = (Scalar *)((long)&local_190 + lVar1);
  }
  else {
    local_180 = (Scalar *)0x0;
  }
  xpr = local_178;
  ptr = local_180;
  *(undefined8 *)(puVar3 + -8) = 0x232f61;
  local_nested_eval_wrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>,_-1,_true>
  ::local_nested_eval_wrapper
            ((local_nested_eval_wrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>,__1,_true>
              *)local_68,xpr,ptr);
  *(undefined8 *)(puVar3 + -8) = 0x232f73;
  Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_16,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_16,_Eigen::Stride<0,_0>_> *)&cols,
             (Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_16,_Eigen::Stride<0,_0>_> *)local_68);
  *(undefined8 *)(puVar3 + -8) = 0x232f7e;
  j = MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_0>
      ::cols((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
              *)dst);
  for (local_a0 = 0; lVar1 = local_a0, local_a0 < j; local_a0 = local_a0 + 1) {
    local_188 = func;
    *(undefined8 *)(puVar3 + -8) = 0x232fc6;
    DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>_>
    ::col(&local_138,
          (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>_>
           *)dst,lVar1);
    lVar1 = local_a0;
    *(undefined8 *)(puVar3 + -8) = 0x232fdc;
    scalar = mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>
             ::coeff((mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>
                      *)&actual_lhs_wrapper.m_deallocate,0,lVar1);
    local_190 = scalar;
    *(undefined8 *)(puVar3 + -8) = 0x232fff;
    Eigen::operator*(&local_170,scalar,(StorageBaseType *)&cols);
    this = local_188;
    *(undefined8 *)(puVar3 + -8) = 0x23301b;
    generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,-1,1,true>,-1,1,false>const>,Eigen::Map<Eigen::Matrix<float,1,-1,1,1,-1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,5>
    ::sub::operator()(this,&local_138,&local_170);
  }
  *(undefined8 *)(puVar3 + -8) = 0x233064;
  local_nested_eval_wrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>,_-1,_true>
  ::~local_nested_eval_wrapper
            ((local_nested_eval_wrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>,__1,_true>
              *)local_68);
  *(undefined8 *)(puVar3 + -8) = 0x23306d;
  evaluator<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::~evaluator
            ((evaluator<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&actual_lhs_wrapper.m_deallocate);
  return;
}

Assistant:

void EIGEN_DEVICE_FUNC outer_product_selector_run(Dst& dst, const Lhs &lhs, const Rhs &rhs, const Func& func, const false_type&)
{
  evaluator<Rhs> rhsEval(rhs);
  ei_declare_local_nested_eval(Lhs,lhs,Rhs::SizeAtCompileTime,actual_lhs);
  // FIXME if cols is large enough, then it might be useful to make sure that lhs is sequentially stored
  // FIXME not very good if rhs is real and lhs complex while alpha is real too
  const Index cols = dst.cols();
  for (Index j=0; j<cols; ++j)
    func(dst.col(j), rhsEval.coeff(Index(0),j) * actual_lhs);
}